

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::mt19937_64>(size_t samples,unsigned_long seed)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *poVar3;
  unsigned_long uVar4;
  result_type rVar5;
  result_type rVar6;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  mt19937_64 r;
  mt19937_64 *in_stack_fffffffffffff600;
  ulong local_9e8;
  mt19937_64 local_9e0;
  ulong local_10;
  ulong local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  trng::mt19937_64::mt19937_64(in_stack_fffffffffffff600);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"# generator ");
  pcVar2 = trng::mt19937_64::name();
  poVar3 = std::operator<<(poVar1,pcVar2);
  poVar3 = std::operator<<(poVar3,"  seed = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"type: d\n");
  poVar3 = std::operator<<(poVar3,"count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_8);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"numbit: ");
  trng::mt19937_64::max();
  trng::mt19937_64::min();
  uVar4 = trng::int_math::log2_ceil<unsigned_long>((unsigned_long)poVar1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  std::operator<<(poVar1,'\n');
  for (local_9e8 = 0; local_9e8 < local_8; local_9e8 = local_9e8 + 1) {
    rVar5 = trng::mt19937_64::operator()(&local_9e0);
    rVar6 = trng::mt19937_64::min();
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar5 - rVar6);
    std::operator<<(poVar1,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}